

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,uint *params_1,uint *params_2,MaybeUint *params_3,
          MaybeUint *params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  uint *params_00;
  uint *params_01;
  long lVar4;
  String argValues [5];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  char *local_60;
  size_t local_58;
  ArrayDisposer *pAStack_50;
  char *local_48;
  size_t sStack_40;
  ArrayDisposer *pAStack_38;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_a8;
  heapString(__return_storage_ptr__,5);
  if ((char *)local_a8.content.size_ != (char *)0x0) {
    local_a8.content.size_ = (size_t)local_a8.content.ptr;
  }
  builtin_strncpy((char *)local_a8.content.size_,"false",5);
  str<unsigned_int&>(&local_90,(kj *)params_1,params_00);
  str<unsigned_int&>(&local_78,(kj *)params_2,params_01);
  BTreeImpl::MaybeUint::toString(&local_c0,params_3);
  local_60 = local_c0.content.ptr;
  local_58 = local_c0.content.size_;
  pAStack_50 = local_c0.content.disposer;
  BTreeImpl::MaybeUint::toString(&local_c0,params_4);
  local_48 = local_c0.content.ptr;
  sStack_40 = local_c0.content.size_;
  pAStack_38 = local_c0.content.disposer;
  uVar5 = 5;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)&local_a8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_a8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_a8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}